

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O0

void test_divceil<std::vector<signed_char,std::allocator<signed_char>>,unsigned_long>
               (vector<signed_char,_std::allocator<signed_char>_> *values,unsigned_long divisor,
               size_t attempt_count)

{
  char cVar1;
  const_iterator __first;
  const_iterator __last;
  ostream *poVar2;
  duration<double,_std::ratio<1L,_1L>_> local_78;
  double local_70;
  rep_conflict time;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  type total_time;
  duration dStack_38;
  char r;
  size_t iteration;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_28;
  value_type total;
  time_point start_time;
  size_t attempt_count_local;
  unsigned_long divisor_local;
  vector<signed_char,_std::allocator<signed_char>_> *values_local;
  
  start_time.__d.__r = (duration)(duration)attempt_count;
  tStack_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  iteration._7_1_ = '\0';
  for (dStack_38.__r = 0; (ulong)dStack_38.__r < (ulong)start_time.__d.__r;
      dStack_38.__r = dStack_38.__r + 1) {
    __first = std::vector<signed_char,_std::allocator<signed_char>_>::begin(values);
    __last = std::vector<signed_char,_std::allocator<signed_char>_>::end(values);
    total_time.__r = divisor;
    cVar1 = std::
            accumulate<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,signed_char,test_divceil<std::vector<signed_char,std::allocator<signed_char>>,unsigned_long>(std::vector<signed_char,std::allocator<signed_char>>const&,unsigned_long,unsigned_long)::_lambda(auto:1,auto:2)_1_>
                      ((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        )__last._M_current,'\0',(anon_class_8_1_e7267f7e)divisor);
    iteration._7_1_ = iteration._7_1_ + cVar1;
  }
  time = (rep_conflict)std::chrono::_V2::steady_clock::now();
  local_60.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&time,&stack0xffffffffffffffd8);
  poVar2 = std::operator<<(&std::clog,(int)iteration._7_1_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_78.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           (&local_60);
  local_70 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_78);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1ecd4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}